

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6_zigzagConversion.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string sStack_68;
  string local_48;
  string s;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"AB",(allocator<char> *)&sStack_68);
  std::__cxx11::string::string((string *)&local_48,(string *)&s);
  convert(&sStack_68,&local_48,1);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&sStack_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&s);
  return 0;
}

Assistant:

int main()
{
	// string s = "PAYPALISHIRING";
	string s="AB";
	int numRows = 1;
	cout<<convert(s,numRows)<<endl;
	return 0;
}